

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::detail::
arg_formatter_base<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_fmt::v6::detail::error_handler>
::write_decimal<int>
          (arg_formatter_base<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_fmt::v6::detail::error_handler>
           *this,int value)

{
  int num_digits;
  char *out;
  uint32_t n;
  
  n = -value;
  if (0 < value) {
    n = value;
  }
  num_digits = count_digits(n);
  out = reserve(this,(ulong)((uint)value >> 0x1f) + (long)num_digits);
  if (value < 0) {
    *out = '-';
    out = out + 1;
  }
  format_decimal<char,unsigned_int>(out,n,num_digits);
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }